

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

QTextFrame * __thiscall QTextDocumentPrivate::rootFrame(QTextDocumentPrivate *this)

{
  QTextFrame *pQVar1;
  long in_RDI;
  long in_FS_OFFSET;
  QTextDocumentPrivate *unaff_retaddr;
  QTextFrameFormat defaultRootFrameFormat;
  QTextFrameFormat *in_stack_ffffffffffffffd0;
  undefined1 *amargin;
  QTextFormat *f;
  
  f = *(QTextFormat **)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x148) == 0) {
    amargin = &DAT_aaaaaaaaaaaaaaaa;
    QTextFrameFormat::QTextFrameFormat(in_stack_ffffffffffffffd0);
    QTextFrameFormat::setMargin((QTextFrameFormat *)f,(qreal)amargin);
    createObject(unaff_retaddr,f,(int)((ulong)amargin >> 0x20));
    pQVar1 = qobject_cast<QTextFrame*>((QObject *)0x7d68c4);
    *(QTextFrame **)(in_RDI + 0x148) = pQVar1;
    QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x7d68dd);
  }
  if (*(QTextFormat **)(in_FS_OFFSET + 0x28) == f) {
    return *(QTextFrame **)(in_RDI + 0x148);
  }
  __stack_chk_fail();
}

Assistant:

QTextFrame *QTextDocumentPrivate::rootFrame() const
{
    if (!rtFrame) {
        QTextFrameFormat defaultRootFrameFormat;
        defaultRootFrameFormat.setMargin(documentMargin);
        rtFrame = qobject_cast<QTextFrame *>(const_cast<QTextDocumentPrivate *>(this)->createObject(defaultRootFrameFormat));
    }
    return rtFrame;
}